

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatzinc.h
# Opt level: O0

void __thiscall FlatZinc::ParserState::~ParserState(ParserState *this)

{
  vector<FlatZinc::ConExpr_*,_std::allocator<FlatZinc::ConExpr_*>_> *unaff_retaddr;
  
  std::vector<FlatZinc::ConExpr_*,_std::allocator<FlatZinc::ConExpr_*>_>::~vector(unaff_retaddr);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)unaff_retaddr);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)unaff_retaddr);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::VarSpec_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::VarSpec_*>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::VarSpec_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::VarSpec_*>_>_>
             *)unaff_retaddr);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::VarSpec_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::VarSpec_*>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::VarSpec_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::VarSpec_*>_>_>
             *)unaff_retaddr);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::VarSpec_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::VarSpec_*>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::VarSpec_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::VarSpec_*>_>_>
             *)unaff_retaddr);
  SymbolTable<std::vector<FlatZinc::AST::SetLit,_std::allocator<FlatZinc::AST::SetLit>_>_>::
  ~SymbolTable((SymbolTable<std::vector<FlatZinc::AST::SetLit,_std::allocator<FlatZinc::AST::SetLit>_>_>
                *)0x13e3a5);
  SymbolTable<FlatZinc::AST::SetLit>::~SymbolTable((SymbolTable<FlatZinc::AST::SetLit> *)0x13e3b6);
  SymbolTable<bool>::~SymbolTable((SymbolTable<bool> *)0x13e3c7);
  SymbolTable<int>::~SymbolTable((SymbolTable<int> *)0x13e3d8);
  SymbolTable<std::vector<int,_std::allocator<int>_>_>::~SymbolTable
            ((SymbolTable<std::vector<int,_std::allocator<int>_>_> *)0x13e3e9);
  SymbolTable<std::vector<int,_std::allocator<int>_>_>::~SymbolTable
            ((SymbolTable<std::vector<int,_std::allocator<int>_>_> *)0x13e3fa);
  SymbolTable<std::vector<int,_std::allocator<int>_>_>::~SymbolTable
            ((SymbolTable<std::vector<int,_std::allocator<int>_>_> *)0x13e40b);
  SymbolTable<std::vector<int,_std::allocator<int>_>_>::~SymbolTable
            ((SymbolTable<std::vector<int,_std::allocator<int>_>_> *)0x13e41c);
  SymbolTable<std::vector<int,_std::allocator<int>_>_>::~SymbolTable
            ((SymbolTable<std::vector<int,_std::allocator<int>_>_> *)0x13e42d);
  SymbolTable<std::vector<int,_std::allocator<int>_>_>::~SymbolTable
            ((SymbolTable<std::vector<int,_std::allocator<int>_>_> *)0x13e43e);
  SymbolTable<int>::~SymbolTable((SymbolTable<int> *)0x13e44f);
  SymbolTable<int>::~SymbolTable((SymbolTable<int> *)0x13e460);
  SymbolTable<int>::~SymbolTable((SymbolTable<int> *)0x13e46e);
  SymbolTable<int>::~SymbolTable((SymbolTable<int> *)0x13e47c);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FlatZinc::AST::Node_*>_>_>
             *)unaff_retaddr);
  return;
}

Assistant:

ParserState(const std::string& b, std::ostream& err0)
			: buf(b.c_str()),
				pos(0),
				length(static_cast<unsigned int>(b.size())),
				fg(nullptr),
				hadError(false),
				err(err0) {}